

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu1.c
# Opt level: O0

void jpegd_write_code_word_number(JpegdHalCtx *ctx,JpegdSyntax *syntax)

{
  void *pvVar1;
  JpegRegSet_conflict *reg;
  JpegdIocRegInfo_conflict *info;
  DcTable *dc_ptr1;
  DcTable *dc_ptr0;
  AcTable *ac_ptr1;
  AcTable *ac_ptr0;
  JpegdSyntax *s;
  JpegdSyntax *syntax_local;
  JpegdHalCtx *ctx_local;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_VDPU1","enter\n","jpegd_write_code_word_number");
  }
  pvVar1 = ctx->regs;
  if (syntax->ac_index[0] == 0) {
    ac_ptr1 = syntax->ac_table;
    dc_ptr0 = (DcTable *)(syntax->ac_table + 1);
  }
  else {
    ac_ptr1 = syntax->ac_table + 1;
    dc_ptr0 = (DcTable *)syntax->ac_table;
  }
  *(uint *)((long)pvVar1 + 0x40) =
       *(uint *)((long)pvVar1 + 0x40) & 0xfffffffc | ac_ptr1->bits[0] & 3;
  *(uint *)((long)pvVar1 + 0x40) =
       *(uint *)((long)pvVar1 + 0x40) & 0xffffffc7 | (ac_ptr1->bits[1] & 7) << 3;
  *(uint *)((long)pvVar1 + 0x40) =
       *(uint *)((long)pvVar1 + 0x40) & 0xfffff87f | (ac_ptr1->bits[2] & 0xf) << 7;
  *(uint *)((long)pvVar1 + 0x40) =
       *(uint *)((long)pvVar1 + 0x40) & 0xffff07ff | (ac_ptr1->bits[3] & 0x1f) << 0xb;
  *(uint *)((long)pvVar1 + 0x40) =
       *(uint *)((long)pvVar1 + 0x40) & 0xffc0ffff | (ac_ptr1->bits[4] & 0x3f) << 0x10;
  *(uint *)((long)pvVar1 + 0x40) =
       *(uint *)((long)pvVar1 + 0x40) & 0x80ffffff | (ac_ptr1->bits[5] & 0x7f) << 0x18;
  *(uint *)((long)pvVar1 + 0x44) =
       *(uint *)((long)pvVar1 + 0x44) & 0xffffff00 | ac_ptr1->bits[6] & 0xff;
  *(uint *)((long)pvVar1 + 0x44) =
       *(uint *)((long)pvVar1 + 0x44) & 0xffff00ff | (ac_ptr1->bits[7] & 0xff) << 8;
  *(uint *)((long)pvVar1 + 0x44) =
       *(uint *)((long)pvVar1 + 0x44) & 0xff00ffff | (ac_ptr1->bits[8] & 0xff) << 0x10;
  *(uint *)((long)pvVar1 + 0x44) =
       *(uint *)((long)pvVar1 + 0x44) & 0xffffff | ac_ptr1->bits[9] << 0x18;
  *(uint *)((long)pvVar1 + 0x48) =
       *(uint *)((long)pvVar1 + 0x48) & 0xffffff00 | ac_ptr1->bits[10] & 0xff;
  *(uint *)((long)pvVar1 + 0x48) =
       *(uint *)((long)pvVar1 + 0x48) & 0xffff00ff | (ac_ptr1->bits[0xb] & 0xff) << 8;
  *(uint *)((long)pvVar1 + 0x48) =
       *(uint *)((long)pvVar1 + 0x48) & 0xff00ffff | (ac_ptr1->bits[0xc] & 0xff) << 0x10;
  *(uint *)((long)pvVar1 + 0x48) =
       *(uint *)((long)pvVar1 + 0x48) & 0xffffff | ac_ptr1->bits[0xd] << 0x18;
  *(uint *)((long)pvVar1 + 0x4c) =
       *(uint *)((long)pvVar1 + 0x4c) & 0xffffff00 | ac_ptr1->bits[0xe] & 0xff;
  *(uint *)((long)pvVar1 + 0x4c) =
       *(uint *)((long)pvVar1 + 0x4c) & 0xffff00ff | (ac_ptr1->bits[0xf] & 0xff) << 8;
  *(uint *)((long)pvVar1 + 0x4c) =
       *(uint *)((long)pvVar1 + 0x4c) & 0xfffcffff | (dc_ptr0->bits[0] & 3) << 0x10;
  *(uint *)((long)pvVar1 + 0x4c) =
       *(uint *)((long)pvVar1 + 0x4c) & 0xffc7ffff | (dc_ptr0->bits[1] & 7) << 0x13;
  *(uint *)((long)pvVar1 + 0x4c) =
       *(uint *)((long)pvVar1 + 0x4c) & 0xf87fffff | (dc_ptr0->bits[2] & 0xf) << 0x17;
  *(uint *)((long)pvVar1 + 0x4c) =
       *(uint *)((long)pvVar1 + 0x4c) & 0x7ffffff | dc_ptr0->bits[3] << 0x1b;
  *(uint *)((long)pvVar1 + 0x50) =
       *(uint *)((long)pvVar1 + 0x50) & 0xffffffc0 | dc_ptr0->bits[4] & 0x3f;
  *(uint *)((long)pvVar1 + 0x50) =
       *(uint *)((long)pvVar1 + 0x50) & 0xffff80ff | (dc_ptr0->bits[5] & 0x7f) << 8;
  *(uint *)((long)pvVar1 + 0x50) =
       *(uint *)((long)pvVar1 + 0x50) & 0xff00ffff | (dc_ptr0->bits[6] & 0xff) << 0x10;
  *(uint *)((long)pvVar1 + 0x50) =
       *(uint *)((long)pvVar1 + 0x50) & 0xffffff | dc_ptr0->bits[7] << 0x18;
  *(uint *)((long)pvVar1 + 0x54) =
       *(uint *)((long)pvVar1 + 0x54) & 0xffffff00 | dc_ptr0->bits[8] & 0xff;
  *(uint *)((long)pvVar1 + 0x54) =
       *(uint *)((long)pvVar1 + 0x54) & 0xffff00ff | (dc_ptr0->bits[9] & 0xff) << 8;
  *(uint *)((long)pvVar1 + 0x54) =
       *(uint *)((long)pvVar1 + 0x54) & 0xff00ffff | (dc_ptr0->bits[10] & 0xff) << 0x10;
  *(uint *)((long)pvVar1 + 0x54) =
       *(uint *)((long)pvVar1 + 0x54) & 0xffffff | dc_ptr0->bits[0xb] << 0x18;
  *(uint *)((long)pvVar1 + 0x58) =
       *(uint *)((long)pvVar1 + 0x58) & 0xffffff00 | dc_ptr0->bits[0xc] & 0xff;
  *(uint *)((long)pvVar1 + 0x58) =
       *(uint *)((long)pvVar1 + 0x58) & 0xffff00ff | (dc_ptr0->bits[0xd] & 0xff) << 8;
  *(uint *)((long)pvVar1 + 0x58) =
       *(uint *)((long)pvVar1 + 0x58) & 0xff00ffff | (dc_ptr0->bits[0xe] & 0xff) << 0x10;
  *(uint *)((long)pvVar1 + 0x58) =
       *(uint *)((long)pvVar1 + 0x58) & 0xffffff | dc_ptr0->bits[0xf] << 0x18;
  if (syntax->dc_index[0] == 0) {
    dc_ptr1 = syntax->dc_table;
    info = (JpegdIocRegInfo_conflict *)(syntax->dc_table + 1);
  }
  else {
    dc_ptr1 = syntax->dc_table + 1;
    info = (JpegdIocRegInfo_conflict *)syntax->dc_table;
  }
  *(uint *)((long)pvVar1 + 0x5c) =
       *(uint *)((long)pvVar1 + 0x5c) & 0xfffffffc | dc_ptr1->bits[0] & 3;
  *(uint *)((long)pvVar1 + 0x5c) =
       *(uint *)((long)pvVar1 + 0x5c) & 0xffffff8f | (dc_ptr1->bits[1] & 7) << 4;
  *(uint *)((long)pvVar1 + 0x5c) =
       *(uint *)((long)pvVar1 + 0x5c) & 0xfffff0ff | (dc_ptr1->bits[2] & 0xf) << 8;
  *(uint *)((long)pvVar1 + 0x5c) =
       *(uint *)((long)pvVar1 + 0x5c) & 0xffff0fff | (dc_ptr1->bits[3] & 0xf) << 0xc;
  *(uint *)((long)pvVar1 + 0x5c) =
       *(uint *)((long)pvVar1 + 0x5c) & 0xfff0ffff | (dc_ptr1->bits[4] & 0xf) << 0x10;
  *(uint *)((long)pvVar1 + 0x5c) =
       *(uint *)((long)pvVar1 + 0x5c) & 0xff0fffff | (dc_ptr1->bits[5] & 0xf) << 0x14;
  *(uint *)((long)pvVar1 + 0x5c) =
       *(uint *)((long)pvVar1 + 0x5c) & 0xf0ffffff | (dc_ptr1->bits[6] & 0xf) << 0x18;
  *(uint *)((long)pvVar1 + 0x5c) =
       *(uint *)((long)pvVar1 + 0x5c) & 0xfffffff | dc_ptr1->bits[7] << 0x1c;
  *(uint *)((long)pvVar1 + 0x60) =
       *(uint *)((long)pvVar1 + 0x60) & 0xfffffff0 | dc_ptr1->bits[8] & 0xf;
  *(uint *)((long)pvVar1 + 0x60) =
       *(uint *)((long)pvVar1 + 0x60) & 0xffffff0f | (dc_ptr1->bits[9] & 0xf) << 4;
  *(uint *)((long)pvVar1 + 0x60) =
       *(uint *)((long)pvVar1 + 0x60) & 0xfffff0ff | (dc_ptr1->bits[10] & 0xf) << 8;
  *(uint *)((long)pvVar1 + 0x60) =
       *(uint *)((long)pvVar1 + 0x60) & 0xffff0fff | (dc_ptr1->bits[0xb] & 0xf) << 0xc;
  *(uint *)((long)pvVar1 + 0x60) =
       *(uint *)((long)pvVar1 + 0x60) & 0xfff0ffff | (dc_ptr1->bits[0xc] & 0xf) << 0x10;
  *(uint *)((long)pvVar1 + 0x60) =
       *(uint *)((long)pvVar1 + 0x60) & 0xff0fffff | (dc_ptr1->bits[0xd] & 0xf) << 0x14;
  *(uint *)((long)pvVar1 + 0x60) =
       *(uint *)((long)pvVar1 + 0x60) & 0xf0ffffff | (dc_ptr1->bits[0xe] & 0xf) << 0x18;
  *(uint *)((long)pvVar1 + 0x60) =
       *(uint *)((long)pvVar1 + 0x60) & 0xfffffff | dc_ptr1->bits[0xf] << 0x1c;
  *(uint *)((long)pvVar1 + 100) =
       *(uint *)((long)pvVar1 + 100) & 0xfffffffc | (uint)(info->regs).reg0_id & 3;
  *(uint *)((long)pvVar1 + 100) =
       *(uint *)((long)pvVar1 + 100) & 0xffffff8f | ((uint)(info->regs).reg1_interrupt & 7) << 4;
  *(uint *)((long)pvVar1 + 100) =
       *(uint *)((long)pvVar1 + 100) & 0xfffff0ff | ((uint)(info->regs).reg2_dec_ctrl & 0xf) << 8;
  *(uint *)((long)pvVar1 + 100) =
       *(uint *)((long)pvVar1 + 100) & 0xffff0fff | ((uint)(info->regs).reg3 & 0xf) << 0xc;
  *(uint *)((long)pvVar1 + 100) =
       *(uint *)((long)pvVar1 + 100) & 0xfff0ffff | ((uint)(info->regs).reg4 & 0xf) << 0x10;
  *(uint *)((long)pvVar1 + 100) =
       *(uint *)((long)pvVar1 + 100) & 0xff0fffff | ((uint)(info->regs).reg5 & 0xf) << 0x14;
  *(uint *)((long)pvVar1 + 100) =
       *(uint *)((long)pvVar1 + 100) & 0xf0ffffff |
       ((uint)(info->regs).reg6_stream_info & 0xf) << 0x18;
  *(uint *)((long)pvVar1 + 100) =
       *(uint *)((long)pvVar1 + 100) & 0xfffffff | (int)(info->regs).reg7 << 0x1c;
  *(uint *)((long)pvVar1 + 0x68) =
       *(uint *)((long)pvVar1 + 0x68) & 0xfffffff0 | (uint)(info->regs).reg8 & 0xf;
  *(uint *)((long)pvVar1 + 0x68) =
       *(uint *)((long)pvVar1 + 0x68) & 0xffffff0f | ((uint)(info->regs).reg9 & 0xf) << 4;
  *(uint *)((long)pvVar1 + 0x68) =
       *(uint *)((long)pvVar1 + 0x68) & 0xfffff0ff |
       ((info->regs).reg10_segment_map_base & 0xf) << 8;
  *(uint *)((long)pvVar1 + 0x68) =
       *(uint *)((long)pvVar1 + 0x68) & 0xffff0fff | ((uint)(info->regs).reg11 & 0xf) << 0xc;
  *(uint *)((long)pvVar1 + 0x68) =
       *(uint *)((long)pvVar1 + 0x68) & 0xfff0ffff |
       ((info->regs).reg12_input_stream_base & 0xf) << 0x10;
  *(uint *)((long)pvVar1 + 0x68) =
       *(uint *)((long)pvVar1 + 0x68) & 0xff0fffff | ((info->regs).reg13_cur_pic_base & 0xf) << 0x14
  ;
  *(uint *)((long)pvVar1 + 0x68) =
       *(uint *)((long)pvVar1 + 0x68) & 0xf0ffffff |
       ((info->regs).reg14_sw_jpg_ch_out_base & 0xf) << 0x18;
  *(uint *)((long)pvVar1 + 0x68) =
       *(uint *)((long)pvVar1 + 0x68) & 0xfffffff | (int)(info->regs).reg15 << 0x1c;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_VDPU1","exit\n","jpegd_write_code_word_number");
  }
  return;
}

Assistant:

static void
jpegd_write_code_word_number(JpegdHalCtx *ctx, JpegdSyntax *syntax)
{
    jpegd_dbg_func("enter\n");
    JpegdSyntax *s = syntax;
    AcTable *ac_ptr0 = NULL, *ac_ptr1 = NULL;
    DcTable *dc_ptr0 = NULL, *dc_ptr1 = NULL;

    JpegdIocRegInfo *info = (JpegdIocRegInfo *)ctx->regs;
    JpegRegSet *reg = &info->regs;

    /* first, select the table we'll use.
     * this trick is done because hardware always wants luma
     * table as AC hardware table 0.
     */
    if (s->ac_index[0] == HUFFMAN_TABLE_ID_ZERO) {
        /* Luma's AC uses Huffman table zero */
        ac_ptr0 = &(s->ac_table[HUFFMAN_TABLE_ID_ZERO]);
        ac_ptr1 = &(s->ac_table[HUFFMAN_TABLE_ID_ONE]);
    } else {
        ac_ptr0 = &(s->ac_table[HUFFMAN_TABLE_ID_ONE]);
        ac_ptr1 = &(s->ac_table[HUFFMAN_TABLE_ID_ZERO]);
    }

    /* write AC table 1 (luma) */
    reg->reg16.sw_ac1_code1_cnt = ac_ptr0->bits[0];
    reg->reg16.sw_ac1_code2_cnt = ac_ptr0->bits[1];
    reg->reg16.sw_ac1_code3_cnt = ac_ptr0->bits[2];
    reg->reg16.sw_ac1_code4_cnt = ac_ptr0->bits[3];
    reg->reg16.sw_ac1_code5_cnt = ac_ptr0->bits[4];
    reg->reg16.sw_ac1_code6_cnt = ac_ptr0->bits[5];

    reg->reg17.sw_ac1_code7_cnt = ac_ptr0->bits[6];
    reg->reg17.sw_ac1_code8_cnt = ac_ptr0->bits[7];
    reg->reg17.sw_ac1_code9_cnt = ac_ptr0->bits[8];
    reg->reg17.sw_ac1_code10_cnt = ac_ptr0->bits[9];

    reg->reg18.sw_ac1_code11_cnt = ac_ptr0->bits[10];
    reg->reg18.sw_ac1_code12_cnt = ac_ptr0->bits[11];
    reg->reg18.sw_ac1_code13_cnt = ac_ptr0->bits[12];
    reg->reg18.sw_ac1_code14_cnt = ac_ptr0->bits[13];

    reg->reg19.sw_ac1_code15_cnt = ac_ptr0->bits[14];
    reg->reg19.sw_ac1_code16_cnt = ac_ptr0->bits[15];

    /* table AC2 (the not-luma table) */
    reg->reg19.sw_ac2_code1_cnt = ac_ptr1->bits[0];
    reg->reg19.sw_ac2_code2_cnt = ac_ptr1->bits[1];
    reg->reg19.sw_ac2_code3_cnt = ac_ptr1->bits[2];
    reg->reg19.sw_ac2_code4_cnt = ac_ptr1->bits[3];

    reg->reg20.sw_ac2_code5_cnt = ac_ptr1->bits[4];
    reg->reg20.sw_ac2_code6_cnt = ac_ptr1->bits[5];
    reg->reg20.sw_ac2_code7_cnt = ac_ptr1->bits[6];
    reg->reg20.sw_ac2_code8_cnt = ac_ptr1->bits[7];

    reg->reg21.sw_ac2_code9_cnt = ac_ptr1->bits[8];
    reg->reg21.sw_ac2_code10_cnt = ac_ptr1->bits[9];
    reg->reg21.sw_ac2_code11_cnt = ac_ptr1->bits[10];
    reg->reg21.sw_ac2_code12_cnt = ac_ptr1->bits[11];

    reg->reg22.sw_ac2_code13_cnt = ac_ptr1->bits[12];
    reg->reg22.sw_ac2_code14_cnt = ac_ptr1->bits[13];
    reg->reg22.sw_ac2_code15_cnt = ac_ptr1->bits[14];
    reg->reg22.sw_ac2_code16_cnt = ac_ptr1->bits[15];

    /* first, select the table we'll use.
     * this trick is done because hardware always wants luma
     * table as DC hardware table 0.
     */
    if (s->dc_index[0] == HUFFMAN_TABLE_ID_ZERO) {
        /* Luma's DC uses Huffman table zero */
        dc_ptr0 = &(s->dc_table[HUFFMAN_TABLE_ID_ZERO]);
        dc_ptr1 = &(s->dc_table[HUFFMAN_TABLE_ID_ONE]);
    } else {
        dc_ptr0 = &(s->dc_table[HUFFMAN_TABLE_ID_ONE]);
        dc_ptr1 = &(s->dc_table[HUFFMAN_TABLE_ID_ZERO]);
    }

    /* write DC table 1 (luma) */
    reg->reg23.sw_dc1_code1_cnt = dc_ptr0->bits[0];
    reg->reg23.sw_dc1_code2_cnt = dc_ptr0->bits[1];
    reg->reg23.sw_dc1_code3_cnt = dc_ptr0->bits[2];
    reg->reg23.sw_dc1_code4_cnt = dc_ptr0->bits[3];
    reg->reg23.sw_dc1_code5_cnt = dc_ptr0->bits[4];
    reg->reg23.sw_dc1_code6_cnt = dc_ptr0->bits[5];
    reg->reg23.sw_dc1_code7_cnt = dc_ptr0->bits[6];
    reg->reg23.sw_dc1_code8_cnt = dc_ptr0->bits[7];

    reg->reg24.sw_dc1_code9_cnt = dc_ptr0->bits[8];
    reg->reg24.sw_dc1_code10_cnt = dc_ptr0->bits[9];
    reg->reg24.sw_dc1_code11_cnt = dc_ptr0->bits[10];
    reg->reg24.sw_dc1_code12_cnt = dc_ptr0->bits[11];
    reg->reg24.sw_dc1_code13_cnt = dc_ptr0->bits[12];
    reg->reg24.sw_dc1_code14_cnt = dc_ptr0->bits[13];
    reg->reg24.sw_dc1_code15_cnt = dc_ptr0->bits[14];
    reg->reg24.sw_dc1_code16_cnt = dc_ptr0->bits[15];

    /* table DC2 (the not-luma table) */
    reg->reg25.sw_dc2_code1_cnt = dc_ptr1->bits[0];
    reg->reg25.sw_dc2_code2_cnt = dc_ptr1->bits[1];
    reg->reg25.sw_dc2_code3_cnt = dc_ptr1->bits[2];
    reg->reg25.sw_dc2_code4_cnt = dc_ptr1->bits[3];
    reg->reg25.sw_dc2_code5_cnt = dc_ptr1->bits[4];
    reg->reg25.sw_dc2_code6_cnt = dc_ptr1->bits[5];
    reg->reg25.sw_dc2_code7_cnt = dc_ptr1->bits[6];
    reg->reg25.sw_dc2_code8_cnt = dc_ptr1->bits[7];

    reg->reg26.sw_dc2_code9_cnt = dc_ptr1->bits[8];
    reg->reg26.sw_dc2_code10_cnt = dc_ptr1->bits[9];
    reg->reg26.sw_dc2_code11_cnt = dc_ptr1->bits[10];
    reg->reg26.sw_dc2_code12_cnt = dc_ptr1->bits[11];
    reg->reg26.sw_dc2_code13_cnt = dc_ptr1->bits[12];
    reg->reg26.sw_dc2_code14_cnt = dc_ptr1->bits[13];
    reg->reg26.sw_dc2_code15_cnt = dc_ptr1->bits[14];
    reg->reg26.sw_dc2_code16_cnt = dc_ptr1->bits[15];

    jpegd_dbg_func("exit\n");
    return;
}